

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O2

int AnalyzePacketUBX(uchar *buf,int buflen,int *pmclass,int *pmid,int *ppacketlen,
                    int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  uint packetlen;
  int iVar1;
  
  *ppacketlen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 8) {
    *pnbBytesToRequest = 8 - buflen;
LAB_00123592:
    iVar1 = 6;
  }
  else {
    if ((*buf == 0xb5) && (buf[1] == 'b')) {
      *pmclass = (uint)buf[2];
      *pmid = (uint)buf[3];
      packetlen = *(ushort *)(buf + 4) + 8;
      *ppacketlen = packetlen;
      if ((uint)buflen <= packetlen && packetlen - buflen != 0) {
        *pnbBytesToRequest = packetlen - buflen;
        goto LAB_00123592;
      }
      iVar1 = CheckChecksumUBX(buf,packetlen);
      if (iVar1 == 0) {
        return 0;
      }
      puts("Warning : UBX checksum error. ");
      *pnbBytesToDiscard = 2;
    }
    else {
      *pnbBytesToDiscard = 1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int AnalyzePacketUBX(unsigned char* buf, int buflen, int* pmclass, int* pmid, int* ppacketlen, 
							int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	*ppacketlen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_PACKET_LENGTH_UBX)
	{
		*pnbBytesToRequest = MIN_PACKET_LENGTH_UBX-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if ((buf[0] != SYNC_CHAR_1_UBX)||(buf[1] != SYNC_CHAR_2_UBX))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the first sync byte can be discarded...
		return EXIT_FAILURE;
	}
	*pmclass = buf[2];
	*pmid = buf[3];
	*ppacketlen = GetPacketLengthUBX(buf);	
	if (buflen < *ppacketlen)
	{
		*pnbBytesToRequest = *ppacketlen-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (CheckChecksumUBX(buf, *ppacketlen) != EXIT_SUCCESS)
	{ 
		printf("Warning : UBX checksum error. \n");
		*pnbBytesToDiscard = 2; // We are only sure that the 2 sync bytes can be discarded...
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}